

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stair_shuffle.c
# Opt level: O3

void clear_all_flags(void)

{
  dungeon_map *pdVar1;
  byte bVar2;
  dungeon_map *pdVar3;
  uint8_t (*pauVar4) [30];
  uint8_t (*pauVar5) [30];
  ulong uVar6;
  ulong uVar7;
  uint8_t (*pauVar8) [30];
  ulong uVar9;
  
  if (maps->index != '\0') {
    pauVar4 = maps->tiles;
    pdVar3 = maps;
    do {
      bVar2 = pdVar3->height;
      if ((ulong)bVar2 != 0) {
        uVar7 = (ulong)pdVar3->width;
        uVar6 = 0;
        pauVar5 = pauVar4;
        do {
          if ((char)uVar7 == '\0') {
            uVar7 = 0;
          }
          else {
            uVar9 = 0;
            pauVar8 = pauVar5;
            do {
              (*pauVar8)[0] = (*pauVar8)[0] & 7;
              uVar9 = uVar9 + 1;
              uVar7 = (ulong)pdVar3->width;
              pauVar8 = pauVar8 + 1;
            } while (uVar9 < uVar7);
          }
          uVar6 = uVar6 + 1;
          pauVar5 = (uint8_t (*) [30])(*pauVar5 + 1);
        } while (uVar6 != bVar2);
      }
      pauVar4 = (uint8_t (*) [30])((long)(pauVar4 + 0x1e) + 3);
      pdVar1 = pdVar3 + 1;
      pdVar3 = pdVar3 + 1;
    } while (pdVar1->index != '\0');
  }
  return;
}

Assistant:

static void clear_all_flags()
{
    dungeon_map *map;
    for (map = maps; map->index; map++) {
        clear_flags(map);
    }
}